

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls.c
# Opt level: O0

int idaNlsInit(IDAMem IDA_mem)

{
  int iVar1;
  IDAMem in_RDI;
  int retval;
  int local_14;
  int local_4;
  
  if (in_RDI->ida_lsetup ==
      (_func_int_IDAMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector *)0x0) {
    local_14 = SUNNonlinSolSetLSetupFn(in_RDI->NLS,0);
  }
  else {
    local_14 = SUNNonlinSolSetLSetupFn(in_RDI->NLS,idaNlsLSetup);
  }
  if (local_14 == 0) {
    if (in_RDI->ida_lsolve ==
        (_func_int_IDAMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector *)0x0) {
      local_14 = SUNNonlinSolSetLSolveFn(in_RDI->NLS,0);
    }
    else {
      local_14 = SUNNonlinSolSetLSolveFn(in_RDI->NLS,idaNlsLSolve);
    }
    if (local_14 == 0) {
      iVar1 = SUNNonlinSolInitialize(in_RDI->NLS);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        IDAProcessError(in_RDI,-0x16,0xe4,"idaNlsInit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls.c"
                        ,"The nonlinear solver\'s init routine failed.");
        local_4 = -0xf;
      }
    }
    else {
      IDAProcessError(in_RDI,-0x16,0xda,"idaNlsInit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls.c"
                      ,"Setting linear solver solve function failed");
      local_4 = -0xf;
    }
  }
  else {
    IDAProcessError(in_RDI,-0x16,0xcc,"idaNlsInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls.c"
                    ,"Setting the linear solver setup function failed");
    local_4 = -0xf;
  }
  return local_4;
}

Assistant:

int idaNlsInit(IDAMem IDA_mem)
{
  int retval;

  /* set the linear solver setup wrapper function */
  if (IDA_mem->ida_lsetup)
  {
    retval = SUNNonlinSolSetLSetupFn(IDA_mem->NLS, idaNlsLSetup);
  }
  else { retval = SUNNonlinSolSetLSetupFn(IDA_mem->NLS, NULL); }

  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting the linear solver setup function failed");
    return (IDA_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (IDA_mem->ida_lsolve)
  {
    retval = SUNNonlinSolSetLSolveFn(IDA_mem->NLS, idaNlsLSolve);
  }
  else { retval = SUNNonlinSolSetLSolveFn(IDA_mem->NLS, NULL); }

  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting linear solver solve function failed");
    return (IDA_NLS_INIT_FAIL);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(IDA_mem->NLS);

  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NLS_INIT_FAIL);
    return (IDA_NLS_INIT_FAIL);
  }

  return (IDA_SUCCESS);
}